

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeObject::~IfcTypeObject(IfcTypeObject *this)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  puVar1 = (undefined8 *)(&this->field_0x0 + lVar2);
  *(undefined8 *)(&this->field_0x0 + lVar2) = 0x827a78;
  *(undefined8 *)(&this->field_0xf0 + lVar2) = 0x827af0;
  *(undefined8 *)(&this->field_0x88 + lVar2) = 0x827aa0;
  *(undefined8 *)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>).
           _vptr_ObjectHelper + lVar2) = 0x827ac8;
  pvVar3 = *(void **)((long)&(this->HasPropertySets).ptr.
                             super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
                             .
                             super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  if ((undefined8 *)puVar1[0x15] != puVar1 + 0x17) {
    operator_delete((undefined8 *)puVar1[0x15]);
  }
  *puVar1 = 0x827c08;
  puVar1[0x1e] = 0x827c30;
  if ((undefined8 *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((undefined8 *)puVar1[0xc]);
  }
  if ((undefined8 *)puVar1[7] != puVar1 + 9) {
    operator_delete((undefined8 *)puVar1[7]);
  }
  if ((undefined8 *)puVar1[2] != puVar1 + 4) {
    operator_delete((undefined8 *)puVar1[2]);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

IfcTypeObject() : Object("IfcTypeObject") {}